

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

MP<135UL,_GF2::MOLex<135UL>_> * __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::Rand(MP<135UL,_GF2::MOLex<135UL>_> *this)

{
  size_t *psVar1;
  _List_node_base **pp_Var2;
  u32 uVar3;
  _List_node_base *p_Var4;
  ulong uVar5;
  MM<135UL> m;
  _List_node_base *local_28 [3];
  
  std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::clear
            (&this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>);
  local_28[0] = (_List_node_base *)0x0;
  local_28[1] = (_List_node_base *)0x0;
  local_28[2] = (_List_node_base *)0x0;
  do {
    uVar3 = Env::Rand();
    if ((uVar3 & 1) != 0) {
      p_Var4 = (_List_node_base *)operator_new(0x28);
      p_Var4[1]._M_next = local_28[0];
      p_Var4[1]._M_prev = local_28[1];
      p_Var4[2]._M_next = local_28[2];
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>).
                super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
    }
    uVar5 = 0;
    do {
      pp_Var2 = local_28 + uVar5;
      *pp_Var2 = (_List_node_base *)((long)&(*pp_Var2)->_M_next + 1);
      if (*pp_Var2 != (_List_node_base *)0x0) goto LAB_00125067;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 3);
    uVar5 = 3;
LAB_00125067:
    if ((1 < uVar5) &&
       ((uVar5 == 3 ||
        (local_28[2] = (_List_node_base *)((ulong)local_28[2] & 0x7f),
        local_28[uVar5] == (_List_node_base *)0x0)))) {
      return this;
    }
  } while( true );
}

Assistant:

MP& Rand()
	{
		SetEmpty();
		MM<_n> m;
		do if (Env::Rand() & 1)
			insert(begin(), m);
		while (_order.Next(m));
		return *this;
	}